

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createUndefFunctionCall
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst,
          Function *func)

{
  uint uVar1;
  Value *val;
  Value *val_00;
  int iVar2;
  long lVar3;
  const_iterator cVar4;
  long *plVar5;
  _Rb_tree_color type;
  CallInst *pCVar6;
  undefined8 *puVar7;
  undefined1 auVar8 [16];
  uint64_t lenVal;
  PSNode *local_68;
  key_type local_60;
  PSNode *local_40;
  PSNode *local_38;
  
  if (this[0x149] == (LLVMPointerGraphBuilder)0x1) {
    auVar8 = llvm::Value::getName();
    if ((auVar8._8_8_ == 4) && (*auVar8._0_8_ == 0x65657266)) {
      local_68 = createFree(this,(Instruction *)CInst);
      goto LAB_00121246;
    }
  }
  if (this[0x14a] == (LLVMPointerGraphBuilder)0x1) {
    auVar8 = llvm::Value::getName();
    if ((auVar8._8_8_ == 0xe) &&
       (*(long *)((long)auVar8._0_8_ + 6) == 0x6574616572635f64 &&
        *auVar8._0_8_ == 0x5f64616572687470)) {
      createPthreadCreate(__return_storage_ptr__,this,CInst);
      return __return_storage_ptr__;
    }
    auVar8 = llvm::Value::getName();
    if ((auVar8._8_8_ == 0xc) &&
       ((int)auVar8._0_8_[1] == 0x6e696f6a && *auVar8._0_8_ == 0x5f64616572687470)) {
      createPthreadJoin(__return_storage_ptr__,this,CInst);
      return __return_storage_ptr__;
    }
    auVar8 = llvm::Value::getName();
    if ((auVar8._8_8_ == 0xc) &&
       ((int)auVar8._0_8_[1] == 0x74697865 && *auVar8._0_8_ == 0x5f64616572687470)) {
      createPthreadExit(__return_storage_ptr__,this,CInst);
      return __return_storage_ptr__;
    }
  }
  auVar8 = llvm::Value::getName();
  lVar3 = auVar8._0_8_;
  if (lVar3 == 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,lVar3,auVar8._8_8_ + lVar3);
  }
  cVar4 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
          ::find((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                  *)(this + 0x100),&local_60);
  if (cVar4._M_node == (_Base_ptr)(this + 0x108)) {
    type = _S_red;
  }
  else {
    type = cVar4._M_node[2]._M_color;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if (type != _S_red) {
    createDynamicMemAlloc(__return_storage_ptr__,this,CInst,type);
    return __return_storage_ptr__;
  }
  if (((byte)func[0x21] & 0x20) != 0) {
    createIntrinsic(__return_storage_ptr__,this,(Instruction *)CInst);
    return __return_storage_ptr__;
  }
  auVar8 = llvm::Value::getName();
  plVar5 = auVar8._0_8_;
  if (auVar8._8_8_ == 0xc) {
    if ((int)plVar5[1] != 0x6b68635f || *plVar5 != 0x7970636d656d5f5f) goto LAB_0012123e;
  }
  else if ((auVar8._8_8_ != 6) ||
          ((*(short *)((long)plVar5 + 4) != 0x7970 || (int)*plVar5 != 0x636d656d &&
           (*(short *)((long)plVar5 + 4) != 0x6576 || (int)*plVar5 != 0x6f6d656d)))) {
LAB_0012123e:
    local_68 = createUnknownCall(this);
LAB_00121246:
    local_60._M_string_length = 1;
    local_60._M_dataplus._M_p = (pointer)&local_68;
    PSNodesSeq::PSNodesSeq(__return_storage_ptr__,(initializer_list<dg::pta::PSNode_*> *)&local_60);
    return __return_storage_ptr__;
  }
  pCVar6 = CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5);
  val = *(Value **)pCVar6;
  val_00 = *(Value **)(pCVar6 + 0x20);
  lVar3 = *(long *)(pCVar6 + 0x40);
  local_68 = Offset::UNKNOWN;
  if ((lVar3 != 0) && (*(char *)(lVar3 + 0x10) == '\x10')) {
    uVar1 = *(uint *)(lVar3 + 0x20);
    puVar7 = (undefined8 *)(lVar3 + 0x18);
    if (0x40 < uVar1) {
      iVar2 = llvm::APInt::countLeadingZerosSlowCase();
      local_68 = (PSNode *)0xffffffffffffffff;
      if (0x40 < uVar1 - iVar2) goto LAB_00121173;
    }
    if (0x40 < uVar1) {
      puVar7 = (undefined8 *)*puVar7;
    }
    local_68 = (PSNode *)*puVar7;
  }
LAB_00121173:
  local_38 = getOperand(this,val_00);
  local_40 = getOperand(this,val);
  local_60._M_dataplus._M_p =
       (pointer)PointerGraph::
                create<(dg::pta::PSNodeType)20,dg::pta::PSNode*,dg::pta::PSNode*,unsigned_long&>
                          ((PointerGraph *)this,&local_38,&local_40,(unsigned_long *)&local_68);
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
  _M_realloc_insert<dg::pta::PSNode*const&>
            ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)__return_storage_ptr__,
             (iterator)0x0,(PSNode **)&local_60);
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createUndefFunctionCall(const llvm::CallInst *CInst,
                                                 const llvm::Function *func) {
    assert(func->empty());
    // is it a call to free? If so, create invalidate node instead.
    if (invalidate_nodes && func->getName().equals("free")) {
        return {createFree(CInst)};
    }
    if (threads_) {
        if (func->getName().equals("pthread_create")) {
            return createPthreadCreate(CInst);
        }
        if (func->getName().equals("pthread_join")) {
            return createPthreadJoin(CInst);
        }
        if (func->getName().equals("pthread_exit")) {
            return createPthreadExit(CInst);
        }
    }
    /// memory allocation (malloc, calloc, etc.)
    auto type = _options.getAllocationFunction(func->getName().str());
    if (type != AllocationFunction::NONE) {
        return createDynamicMemAlloc(CInst, type);
    }
    if (func->isIntrinsic()) {
        return createIntrinsic(CInst);
    }

    // mempy/memmove
    const auto &funname = func->getName();
    if (funname.equals("memcpy") || funname.equals("__memcpy_chk") ||
        funname.equals("memove")) {
        auto *dest = CInst->getOperand(0);
        auto *src = CInst->getOperand(1);
        auto lenVal = llvmutils::getConstantValue(CInst->getOperand(2));
        return PS.create<PSNodeType::MEMCPY>(getOperand(src), getOperand(dest),
                                             lenVal);
    }

    return {createUnknownCall()};
}